

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

void __thiscall ieee754::set_mbit(ieee754 *this,int n,int bit)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = n + this->ebits + 1;
  iVar3 = this->bytes + iVar2 / -8 + -1;
  bVar1 = (byte)(1 << (7U - (char)(iVar2 % 8) & 0x1f));
  if (bit != 0) {
    this->buf[iVar3] = this->buf[iVar3] | bVar1;
    return;
  }
  this->buf[iVar3] = this->buf[iVar3] & ~bVar1;
  return;
}

Assistant:

void set_mbit(int n, int bit)
    {
        /* get the mantissa byte index and mask */
        int byteidx;
        unsigned char mask;
        get_mbit_ptr(byteidx, mask, n);

        /* set or clear the bit */
        if (bit)
            buf[byteidx] |= mask;
        else
            buf[byteidx] &= ~mask;
    }